

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O0

int ReleaseGlobals(void)

{
  int local_c;
  int i;
  
  bDeleteRoute = 1;
  nbwpstmp = 0;
  memset(wpstmplat,0,0x2000);
  memset(wpstmplong,0,0x2000);
  memset(wpstmpalt,0,0x2000);
  bWaypointsChanged = 1;
  nbWPs = 0;
  CurWP = 0;
  memset(wpslat,0,0x2000);
  memset(wpslong,0,0x2000);
  memset(wpsalt,0,0x2000);
  DeleteCriticalSection(&strtimeCS);
  DeleteCriticalSection(&RegistersCS);
  DeleteCriticalSection(&idsCS);
  DeleteCriticalSection(&OpenCVVideoRecordCS);
  DeleteCriticalSection(&OpenCVVideoCS);
  DeleteCriticalSection(&OpenCVGUICS);
  DeleteCriticalSection(&MissionFilesCS);
  DeleteCriticalSection(&StateVariablesCS);
  DeleteCriticalSection(&SeanetDataCS);
  DeleteCriticalSection(&SeanetConnectingCS);
  DeleteCriticalSection(&SeanetOverlayImgCS);
  DeleteCriticalSection(&MDMCS);
  DeleteCriticalSection(&FollowMeCS);
  for (local_c = 7; -1 < local_c; local_c = local_c + -1) {
    DeleteCriticalSection(ExternalProgramTriggerCS + local_c);
  }
  DeleteCriticalSection(&SonarAltitudeEstimationCS);
  local_c = nbopencvgui;
  while (local_c = local_c + -1, -1 < local_c) {
    DeleteCriticalSection(dispimgsCS + local_c);
  }
  for (local_c = 4; -1 < local_c; local_c = local_c + -1) {
    videorecordheight[local_c] = videoimgheight;
    videorecordwidth[local_c] = videoimgwidth;
    memset(endvideorecordfilenames + local_c,0,0x100);
    endvideorecordfiles[local_c] = (FILE *)0x0;
    memset(videorecordfilenames + local_c,0,0x100);
    bVideoRecordRestart[local_c] = 0;
    VideoRecordRequests[local_c] = 0;
    DeleteCriticalSection(VideoRecordRequestsCS + local_c);
    bRestartVideo[local_c] = 0;
    bPauseVideo[local_c] = 0;
    xVideo[local_c] = 0.0;
    yVideo[local_c] = 0.0;
    zVideo[local_c] = 0.0;
    phiVideo[local_c] = 0.0;
    thetaVideo[local_c] = 0.0;
    psiVideo[local_c] = 0.0;
    VerticalBeamVideo[local_c] = 50.0;
    HorizontalBeamVideo[local_c] = 70.0;
    DeleteCriticalSection(imgsCS + local_c);
  }
  for (local_c = 2; -1 < local_c; local_c = local_c + -1) {
    bRestartPololu[local_c] = 0;
    bPausePololu[local_c] = 0;
    SetPositionMaestroPololu[local_c] = -1;
    ShowGetPositionMaestroPololu[local_c] = -1;
  }
  for (local_c = 1; -1 < local_c; local_c = local_c + -1) {
    bRestartRoboteq[local_c] = 0;
    bPauseRoboteq[local_c] = 0;
  }
  for (local_c = 2; -1 < local_c; local_c = local_c + -1) {
    bRestartMAVLinkDevice[local_c] = 0;
    bPauseMAVLinkDevice[local_c] = 0;
    GNSSqualityMAVLinkDevice[local_c] = 0;
    land_altitudeMAVLinkDevice[local_c] = 0.0;
    land_longitudeMAVLinkDevice[local_c] = 0.0;
    land_latitudeMAVLinkDevice[local_c] = 0.0;
    land_yawMAVLinkDevice[local_c] = 0.0;
    bLandMAVLinkDevice[local_c] = 0;
    takeoff_altitudeMAVLinkDevice[local_c] = 0.0;
    bTakeoffMAVLinkDevice[local_c] = 0;
    setattitudetargetthrustMAVLinkDevice[local_c] = 0.0;
    setattitudetargetyaw_rateMAVLinkDevice[local_c] = 0.0;
    setattitudetargetpitch_rateMAVLinkDevice[local_c] = 0.0;
    setattitudetargetroll_rateMAVLinkDevice[local_c] = 0.0;
    setattitudetargetyawMAVLinkDevice[local_c] = 0.0;
    setattitudetargetpitchMAVLinkDevice[local_c] = 0.0;
    setattitudetargetrollMAVLinkDevice[local_c] = 0.0;
    setattitudetargettypeMAVLinkDevice[local_c] = -1;
    setattitudetargetperiodMAVLinkDevice[local_c] = -1;
    iArmMAVLinkDevice[local_c] = -1;
    custom_modeMAVLinkDevice[local_c] = -1;
    bDisplayStatusTextMAVLinkDevice[local_c] = 0;
    bEnableMAVLinkDeviceIN[local_c] = 0;
  }
  for (local_c = 2; -1 < local_c; local_c = local_c + -1) {
    std::
    vector<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::pop_back(&RTCMuserslist);
    bRestartublox[local_c] = 0;
    bPauseublox[local_c] = 0;
    GNSSqualityublox[local_c] = 0;
  }
  for (local_c = 1; -1 < local_c; local_c = local_c + -1) {
    bRestartNMEADevice[local_c] = 0;
    bPauseNMEADevice[local_c] = 0;
    GNSSqualityNMEADevice[local_c] = 0;
  }
  for (local_c = 1; -1 < local_c; local_c = local_c + -1) {
    bRestartBlueView[local_c] = 0;
    bPauseBlueView[local_c] = 0;
  }
  return 0;
}

Assistant:

inline int ReleaseGlobals(void)
{
	int i = 0;

	bDeleteRoute = TRUE;
	nbwpstmp = 0;
	memset(wpstmplat, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmplong, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmpalt, 0, MAX_NB_WP*sizeof(double));
	bWaypointsChanged = TRUE;
	nbWPs = 0;
	CurWP = 0;
	memset(wpslat, 0, MAX_NB_WP*sizeof(double));
	memset(wpslong, 0, MAX_NB_WP*sizeof(double));
	memset(wpsalt, 0, MAX_NB_WP*sizeof(double));

	DeleteCriticalSection(&strtimeCS);

	DeleteCriticalSection(&RegistersCS);

	DeleteCriticalSection(&idsCS);

	DeleteCriticalSection(&OpenCVVideoRecordCS);
	DeleteCriticalSection(&OpenCVVideoCS);
	DeleteCriticalSection(&OpenCVGUICS);

	DeleteCriticalSection(&MissionFilesCS);

	DeleteCriticalSection(&StateVariablesCS);

#ifndef DISABLE_OPENCV_SUPPORT
	cvReleaseImage(&SeanetOverlayImg);
#endif // !DISABLE_OPENCV_SUPPORT
	DeleteCriticalSection(&SeanetDataCS);
	DeleteCriticalSection(&SeanetConnectingCS);
	DeleteCriticalSection(&SeanetOverlayImgCS);

	DeleteCriticalSection(&MDMCS);

	DeleteCriticalSection(&FollowMeCS);

	for (i = MAX_NB_EXTERNALPROGRAMTRIGGER-1; i >= 0; i--)
	{
		DeleteCriticalSection(&ExternalProgramTriggerCS[i]);
	}

#ifndef DISABLE_OPENCV_SUPPORT
	cvReleaseImage(&PingerOverlayImg);
	DeleteCriticalSection(&PingerOverlayImgCS);
	DeleteCriticalSection(&PingerCS);

	cvReleaseImage(&ObstacleOverlayImg);
	DeleteCriticalSection(&ObstacleOverlayImgCS);
	DeleteCriticalSection(&ObstacleCS);

	cvReleaseImage(&SurfaceVisualObstacleOverlayImg);
	DeleteCriticalSection(&SurfaceVisualObstacleOverlayImgCS);
	DeleteCriticalSection(&SurfaceVisualObstacleCS);
		
	for (i = MAX_NB_BALL-1; i >= 0; i--)
	{
		cvReleaseImage(&BallOverlayImg[i]);
		DeleteCriticalSection(&BallOverlayImgCS[i]);
		DeleteCriticalSection(&BallCS[i]);
	}

	cvReleaseImage(&WallOverlayImg);
	DeleteCriticalSection(&WallOverlayImgCS);
	DeleteCriticalSection(&WallCS);

	cvReleaseImage(&ExternalVisualLocalizationOverlayImg);
	DeleteCriticalSection(&ExternalVisualLocalizationOverlayImgCS);
	DeleteCriticalSection(&ExternalVisualLocalizationCS);
#endif // !DISABLE_OPENCV_SUPPORT

	DeleteCriticalSection(&SonarAltitudeEstimationCS);

	for (i = nbopencvgui-1; i >= 0; i--)
	{
#ifndef DISABLE_OPENCV_SUPPORT
		cvReleaseImage(&dispimgs[i]);
#endif // !DISABLE_OPENCV_SUPPORT
		DeleteCriticalSection(&dispimgsCS[i]);
	}

	for (i = MAX_NB_VIDEO-1; i >= 0; i--)
	{
		videorecordheight[i] = videoimgheight;
		videorecordwidth[i] = videoimgwidth;
		memset(endvideorecordfilenames[i], 0, sizeof(endvideorecordfilenames[i]));
		endvideorecordfiles[i] = NULL;
		memset(videorecordfilenames[i], 0, sizeof(videorecordfilenames[i]));
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		videorecordfiles[i] = NULL;
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
		bVideoRecordRestart[i] = FALSE;
		VideoRecordRequests[i] = 0;
		DeleteCriticalSection(&VideoRecordRequestsCS[i]);
		bRestartVideo[i] = FALSE;
		bPauseVideo[i] = FALSE;
		xVideo[i] = 0; yVideo[i] = 0; zVideo[i] = 0; phiVideo[i] = 0; thetaVideo[i] = 0; psiVideo[i] = 0;
		VerticalBeamVideo[i]  = 50;
		HorizontalBeamVideo[i] = 70;
#ifndef DISABLE_OPENCV_SUPPORT
		if (!bUseRawImgPtrVideo) cvReleaseImage(&imgs[i]); else cvReleaseImage(&imgsbak[i]); // imgsbak has been kept in case imgs was overwritten...
#endif // !DISABLE_OPENCV_SUPPORT
		DeleteCriticalSection(&imgsCS[i]);
	}

	for (i = MAX_NB_POLOLU-1; i >= 0; i--)
	{
		bRestartPololu[i] = FALSE;
		bPausePololu[i] = FALSE;
		SetPositionMaestroPololu[i] = -1;
		ShowGetPositionMaestroPololu[i] = -1;
	}

	for (i = MAX_NB_ROBOTEQ-1; i >= 0; i--)
	{
		bRestartRoboteq[i] = FALSE;
		bPauseRoboteq[i] = FALSE;
	}

	for (i = MAX_NB_MAVLINKDEVICE-1; i >= 0; i--)
	{
		bRestartMAVLinkDevice[i] = FALSE;
		bPauseMAVLinkDevice[i] = FALSE;
		GNSSqualityMAVLinkDevice[i] = 0;
		land_altitudeMAVLinkDevice[i] = 0;
		land_longitudeMAVLinkDevice[i] = 0;
		land_latitudeMAVLinkDevice[i] = 0;
		land_yawMAVLinkDevice[i] = 0;
		bLandMAVLinkDevice[i] = FALSE;
		takeoff_altitudeMAVLinkDevice[i] = 0;
		bTakeoffMAVLinkDevice[i] = FALSE;
		setattitudetargetthrustMAVLinkDevice[i] = 0;
		setattitudetargetyaw_rateMAVLinkDevice[i] = 0;
		setattitudetargetpitch_rateMAVLinkDevice[i] = 0;
		setattitudetargetroll_rateMAVLinkDevice[i] = 0;
		setattitudetargetyawMAVLinkDevice[i] = 0;
		setattitudetargetpitchMAVLinkDevice[i] = 0;
		setattitudetargetrollMAVLinkDevice[i] = 0;
		setattitudetargettypeMAVLinkDevice[i] = -1;
		setattitudetargetperiodMAVLinkDevice[i] = -1;
		iArmMAVLinkDevice[i] = -1;
		custom_modeMAVLinkDevice[i] = -1;
		bDisplayStatusTextMAVLinkDevice[i] = FALSE;
		bEnableMAVLinkDeviceIN[i] = FALSE;
	}

	for (i = MAX_NB_UBLOX-1; i >= 0; i--)
	{
		RTCMuserslist.pop_back();
		bRestartublox[i] = FALSE;
		bPauseublox[i] = FALSE;
		GNSSqualityublox[i] = 0;
	}

	for (i = MAX_NB_NMEADEVICE-1; i >= 0; i--)
	{
		bRestartNMEADevice[i] = FALSE;
		bPauseNMEADevice[i] = FALSE;
		GNSSqualityNMEADevice[i] = 0;
	}

	for (i = MAX_NB_BLUEVIEW-1; i >= 0; i--)
	{
		bRestartBlueView[i] = FALSE;
		bPauseBlueView[i] = FALSE;
	}

	return EXIT_SUCCESS;
}